

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationStringFormat_Test::TestBody
          (TimeUtilTest_DurationStringFormat_Test *this)

{
  bool bVar1;
  Timestamp *in_RCX;
  char *pcVar2;
  Duration *pDVar3;
  Duration *duration;
  Duration *duration_00;
  Duration *duration_01;
  Duration *duration_02;
  Duration *duration_03;
  Duration *duration_04;
  char *message;
  char *in_R9;
  pointer *__ptr;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Duration d;
  Timestamp end;
  Timestamp begin;
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  AssertHelper local_98;
  Duration local_90;
  Timestamp local_68;
  Timestamp local_40;
  
  Timestamp::Timestamp(&local_40,(Arena *)0x0);
  Timestamp::Timestamp(&local_68,(Arena *)0x0);
  value._M_str = (char *)&local_40;
  value._M_len = (size_t)"0001-01-01T00:00:00Z";
  local_b8[0] = TimeUtil::FromString((TimeUtil *)&DAT_00000014,value,in_RCX);
  local_b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_90,(internal *)local_b8,
               (AssertionResult *)"TimeUtil::FromString(\"0001-01-01T00:00:00Z\", &begin)","false",
               "true",in_R9);
    in_RCX = (Timestamp *)0x4b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x4b,(char *)local_90.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)
        local_90.super_Message.super_MessageLite._vptr_MessageLite != &local_90.field_0) {
      operator_delete(local_90.super_Message.super_MessageLite._vptr_MessageLite,
                      local_90.field_0._0_8_ + 1);
    }
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_c8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  value_00._M_str = (char *)&local_68;
  value_00._M_len = (size_t)"9999-12-31T23:59:59.999999999Z";
  local_b8[0] = TimeUtil::FromString((TimeUtil *)&DAT_0000001e,value_00,in_RCX);
  local_b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_90,(internal *)local_b8,
               (AssertionResult *)"TimeUtil::FromString(\"9999-12-31T23:59:59.999999999Z\", &end)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x4c,(char *)local_90.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)
        local_90.super_Message.super_MessageLite._vptr_MessageLite != &local_90.field_0) {
      operator_delete(local_90.super_Message.super_MessageLite._vptr_MessageLite,
                      local_90.field_0._0_8_ + 1);
    }
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  operator-(&local_90,&local_68,&local_40);
  TimeUtil::ToString_abi_cxx11_((string *)local_b8,(TimeUtil *)&local_90,duration);
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            ((internal *)local_c8,"\"315537897599.999999999s\"","TimeUtil::ToString(end - begin)",
             (char (*) [24])0x1280e30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_c0 == (undefined1  [8])0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_90.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_90.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  operator-(&local_90,&local_40,&local_68);
  TimeUtil::ToString_abi_cxx11_((string *)local_b8,(TimeUtil *)&local_90,duration_00);
  testing::internal::CmpHelperEQ<char[25],std::__cxx11::string>
            ((internal *)local_c8,"\"-315537897599.999999999s\"","TimeUtil::ToString(begin - end)",
             (char (*) [25])"-315537897599.999999999s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_c0 == (undefined1  [8])0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_90.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_90.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  local_c8._0_4_ = 999999999;
  operator-(&local_90,&local_68,&local_40);
  local_d0._0_4_ = local_90.field_0._impl_.nanos_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b8,"999999999","(end - begin).nanos()",(int *)local_c8,
             (int *)local_d0);
  Duration::~Duration(&local_90);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_90.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_90.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  local_c8._0_4_ = 0xc4653601;
  operator-(&local_90,&local_40,&local_68);
  local_d0._0_4_ = local_90.field_0._impl_.nanos_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b8,"-999999999","(begin - end).nanos()",(int *)local_c8,
             (int *)local_d0);
  Duration::~Duration(&local_90);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_90.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_90.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  TimeUtil::SecondsToDuration(&local_90,1);
  TimeUtil::ToString_abi_cxx11_((string *)local_b8,(TimeUtil *)&local_90,duration_01);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_c8,"\"1s\"","TimeUtil::ToString(TimeUtil::SecondsToDuration(1))",
             (char (*) [3])0x1281370,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_c0 == (undefined1  [8])0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_90.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_90.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  TimeUtil::MillisecondsToDuration(&local_90,10);
  TimeUtil::ToString_abi_cxx11_((string *)local_b8,(TimeUtil *)&local_90,duration_02);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)local_c8,"\"0.010s\"",
             "TimeUtil::ToString(TimeUtil::MillisecondsToDuration(10))",(char (*) [7])"0.010s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_c0 == (undefined1  [8])0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_90.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_90.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  TimeUtil::MicrosecondsToDuration(&local_90,10);
  TimeUtil::ToString_abi_cxx11_((string *)local_b8,(TimeUtil *)&local_90,duration_03);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)local_c8,"\"0.000010s\"",
             "TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(10))",(char (*) [10])"0.000010s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_c0 == (undefined1  [8])0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_90.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_90.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  TimeUtil::NanosecondsToDuration(&local_90,10);
  TimeUtil::ToString_abi_cxx11_((string *)local_b8,(TimeUtil *)&local_90,duration_04);
  pcVar2 = "0.000000010s";
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)local_c8,"\"0.000000010s\"",
             "TimeUtil::ToString(TimeUtil::NanosecondsToDuration(10))",(char (*) [13])"0.000000010s"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
  }
  Duration::~Duration(&local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_c0 == (undefined1  [8])0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = *(char **)local_c0;
    }
    pcVar2 = (char *)0x5c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x5c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_90.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*local_90.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  Duration::Duration(&local_90,(Arena *)0x0);
  value_01._M_str = (char *)&local_90;
  value_01._M_len = (size_t)"0.1s";
  bVar1 = TimeUtil::FromString((TimeUtil *)&DAT_00000004,value_01,(Duration *)pcVar2);
  local_c8[0] = (internal)bVar1;
  local_c0 = (undefined1  [8])0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_c8,
               (AssertionResult *)"TimeUtil::FromString(\"0.1s\", &d)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x61,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
    }
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  local_d0._0_4_ = 100;
  local_c8 = (undefined1  [8])TimeUtil::DurationToMilliseconds(&local_90);
  pDVar3 = (Duration *)local_d0;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_b8,"100","TimeUtil::DurationToMilliseconds(d)",(int *)pDVar3,
             (long *)local_c8);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_b8._8_8_;
    }
    pDVar3 = (Duration *)0x62;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x62,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  value_02._M_str = (char *)&local_90;
  value_02._M_len = (size_t)"0.0001s";
  bVar1 = TimeUtil::FromString((TimeUtil *)&DAT_00000007,value_02,pDVar3);
  local_c8[0] = (internal)bVar1;
  local_c0 = (undefined1  [8])0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_c8,
               (AssertionResult *)"TimeUtil::FromString(\"0.0001s\", &d)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,99,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
    }
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  local_d0._0_4_ = 100;
  local_c8 = (undefined1  [8])TimeUtil::DurationToMicroseconds(&local_90);
  pDVar3 = (Duration *)local_d0;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_b8,"100","TimeUtil::DurationToMicroseconds(d)",(int *)pDVar3,
             (long *)local_c8);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_b8._8_8_;
    }
    pDVar3 = (Duration *)&DAT_00000064;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  value_03._M_str = (char *)&local_90;
  value_03._M_len = (size_t)"0.0000001s";
  bVar1 = TimeUtil::FromString((TimeUtil *)&DAT_0000000a,value_03,pDVar3);
  local_c8[0] = (internal)bVar1;
  local_c0 = (undefined1  [8])0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_c8,
               (AssertionResult *)"TimeUtil::FromString(\"0.0000001s\", &d)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x65,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
    }
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  local_d0._0_4_ = 100;
  local_c8 = (undefined1  [8])TimeUtil::DurationToNanoseconds(&local_90);
  pDVar3 = (Duration *)local_d0;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_b8,"100","TimeUtil::DurationToNanoseconds(d)",(int *)pDVar3,
             (long *)local_c8);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_b8._8_8_;
    }
    pDVar3 = (Duration *)&DAT_00000066;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  value_04._M_str = (char *)&local_90;
  value_04._M_len = (size_t)"315576000000.999999999s";
  bVar1 = TimeUtil::FromString((TimeUtil *)&DAT_00000017,value_04,pDVar3);
  local_c8[0] = (internal)bVar1;
  local_c0 = (undefined1  [8])0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_c8,
               (AssertionResult *)"TimeUtil::FromString(\"315576000000.999999999s\", &d)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6a,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
    }
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  local_c8 = (undefined1  [8])&DAT_4979cb9e00;
  local_d0 = (undefined1  [8])local_90.field_0._impl_.seconds_;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_b8,"int64_t{315576000000}","d.seconds()",(long *)local_c8,
             (long *)local_d0);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  pDVar3 = (Duration *)local_c8;
  local_c8._0_4_ = 999999999;
  local_d0._0_4_ = local_90.field_0._impl_.nanos_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b8,"999999999","d.nanos()",(int *)pDVar3,(int *)local_d0);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_b8._8_8_;
    }
    pDVar3 = (Duration *)0x6c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  value_05._M_str = (char *)&local_90;
  value_05._M_len = (size_t)"-315576000000.999999999s";
  bVar1 = TimeUtil::FromString((TimeUtil *)&DAT_00000018,value_05,pDVar3);
  local_c8[0] = (internal)bVar1;
  local_c0 = (undefined1  [8])0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,(internal *)local_c8,
               (AssertionResult *)"TimeUtil::FromString(\"-315576000000.999999999s\", &d)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6d,(char *)CONCAT71(local_b8._1_7_,local_b8[0]));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b8._1_7_,local_b8[0]) != &local_a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b8._1_7_,local_b8[0]),local_a8._M_allocated_capacity + 1);
    }
    if (local_d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d0 + 8))();
    }
  }
  if (local_c0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  local_c8 = (undefined1  [8])&DAT_ffffffb686346200;
  local_d0 = (undefined1  [8])local_90.field_0._impl_.seconds_;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_b8,"int64_t{-315576000000}","d.seconds()",(long *)local_c8,
             (long *)local_d0);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  local_c8._0_4_ = 0xc4653601;
  local_d0._0_4_ = local_90.field_0._impl_.nanos_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_b8,"-999999999","d.nanos()",(int *)local_c8,(int *)local_d0);
  if ((internal)local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = *(char **)local_b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_b8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
                );
  }
  Duration::~Duration(&local_90);
  Timestamp::~Timestamp(&local_68);
  Timestamp::~Timestamp(&local_40);
  return;
}

Assistant:

TEST(TimeUtilTest, DurationStringFormat) {
  Timestamp begin, end;
  EXPECT_TRUE(TimeUtil::FromString("0001-01-01T00:00:00Z", &begin));
  EXPECT_TRUE(TimeUtil::FromString("9999-12-31T23:59:59.999999999Z", &end));

  // These these are out of bounds for 32-bit architectures.
  if(sizeof(time_t) >= sizeof(uint64_t)) {
    EXPECT_EQ("315537897599.999999999s", TimeUtil::ToString(end - begin));
    EXPECT_EQ("-315537897599.999999999s", TimeUtil::ToString(begin - end));
  }
  EXPECT_EQ(999999999, (end - begin).nanos());
  EXPECT_EQ(-999999999, (begin - end).nanos());

  // Generated output should contain 3, 6, or 9 fractional digits.
  EXPECT_EQ("1s", TimeUtil::ToString(TimeUtil::SecondsToDuration(1)));
  EXPECT_EQ("0.010s", TimeUtil::ToString(TimeUtil::MillisecondsToDuration(10)));
  EXPECT_EQ("0.000010s",
            TimeUtil::ToString(TimeUtil::MicrosecondsToDuration(10)));
  EXPECT_EQ("0.000000010s",
            TimeUtil::ToString(TimeUtil::NanosecondsToDuration(10)));

  // Parsing accepts an fractional digits as long as they fit into nano
  // precision.
  Duration d;
  EXPECT_TRUE(TimeUtil::FromString("0.1s", &d));
  EXPECT_EQ(100, TimeUtil::DurationToMilliseconds(d));
  EXPECT_TRUE(TimeUtil::FromString("0.0001s", &d));
  EXPECT_EQ(100, TimeUtil::DurationToMicroseconds(d));
  EXPECT_TRUE(TimeUtil::FromString("0.0000001s", &d));
  EXPECT_EQ(100, TimeUtil::DurationToNanoseconds(d));

  // Duration must support range from -315,576,000,000s to +315576000000s
  // which includes negative values.
  EXPECT_TRUE(TimeUtil::FromString("315576000000.999999999s", &d));
  EXPECT_EQ(int64_t{315576000000}, d.seconds());
  EXPECT_EQ(999999999, d.nanos());
  EXPECT_TRUE(TimeUtil::FromString("-315576000000.999999999s", &d));
  EXPECT_EQ(int64_t{-315576000000}, d.seconds());
  EXPECT_EQ(-999999999, d.nanos());
}